

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::tuple_caster<std::pair,_unsigned_int,_unsigned_int>::load
          (tuple_caster<std::pair,_unsigned_int,_unsigned_int> *this,handle src,bool convert)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  handle local_28;
  sequence seq;
  
  if ((src.m_ptr != (PyObject *)0x0) && (iVar2 = PySequence_Check(src.m_ptr), iVar2 != 0)) {
    (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
    local_28.m_ptr = src.m_ptr;
    sVar3 = sequence::size((sequence *)&local_28);
    if (sVar3 == 2) {
      bVar1 = tuple_caster<std::pair,unsigned_int,unsigned_int>::load_impl<0ul,1ul>
                        ((tuple_caster<std::pair,unsigned_int,unsigned_int> *)this,&local_28,convert
                        );
    }
    else {
      bVar1 = false;
    }
    object::~object((object *)&local_28);
    return bVar1;
  }
  return false;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src))
            return false;
        const auto seq = reinterpret_borrow<sequence>(src);
        if (seq.size() != size)
            return false;
        return load_impl(seq, convert, indices{});
    }